

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O3

void riscv_cpu_reset(CPUState_conflict *dev)

{
  (*(code *)dev[1].tb_jmp_cache[0x221])();
  dev[1].tb_jmp_cache[0x18d] = (TranslationBlock_conflict *)0x3;
  dev[1].tb_jmp_cache[0x191] =
       (TranslationBlock_conflict *)((ulong)dev[1].tb_jmp_cache[0x191] & 0xfffffffffffdfff7);
  dev[1].tb_jmp_cache[0x1a0] = (TranslationBlock_conflict *)0x0;
  dev[1].tb_jmp_cache[0x183] = dev[1].tb_jmp_cache[399];
  dev->exception_index = -1;
  dev[1].tb_jmp_cache[0x184] = (TranslationBlock_conflict *)0xffffffffffffffff;
  *(undefined1 *)((long)dev[1].tb_jmp_cache + 0x101f) = 1;
  return;
}

Assistant:

static void riscv_cpu_reset(CPUState *dev)
{
    CPUState *cs = CPU(dev);
    RISCVCPU *cpu = RISCV_CPU(cs);
    RISCVCPUClass *mcc = RISCV_CPU_GET_CLASS(cpu);
    CPURISCVState *env = &cpu->env;

    mcc->parent_reset(cs);

    env->priv = PRV_M;
    env->mstatus &= ~(MSTATUS_MIE | MSTATUS_MPRV);
    env->mcause = 0;
    env->pc = env->resetvec;

    cs->exception_index = EXCP_NONE;
    env->load_res = -1;
    set_default_nan_mode(1, &env->fp_status);
}